

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_use.cpp
# Opt level: O1

unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>,_true> __thiscall
duckdb::Transformer::TransformUse(Transformer *this,PGUseStmt *stmt)

{
  Transformer *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  string *psVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var4;
  bool bVar5;
  long *plVar6;
  ConstantExpression *this_00;
  ParserException *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  undefined8 uVar9;
  templated_unique_single_t name_expr;
  string name;
  QualifiedName qualified_name;
  undefined1 local_190 [64];
  string local_150;
  undefined1 local_130 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  Value local_110;
  bool *local_d0;
  long local_c8;
  bool local_c0 [16];
  string local_b0;
  QualifiedName local_90;
  
  TransformQualifiedName(&local_90,(Transformer *)stmt,*(PGRangeVar **)(in_RDX + 8));
  bVar5 = IsInvalidCatalog(&local_90.catalog);
  if (!bVar5) {
    this_01 = (ParserException *)__cxa_allocate_exception(0x10);
    local_190._0_8_ = local_190 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_190,"Expected \"USE database\" or \"USE database.schema\"","");
    ParserException::ParserException(this_01,(string *)local_190);
    __cxa_throw(this_01,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_c8 = 0;
  local_c0[0] = false;
  local_d0 = local_c0;
  bVar5 = IsInvalidSchema(&local_90.schema);
  if (bVar5) {
    KeywordHelper::WriteOptionallyQuoted((string *)local_190,&local_90.name,'\"',true);
    ::std::__cxx11::string::operator=((string *)&local_d0,(string *)local_190);
    psVar3 = (string *)local_190;
    local_150._M_dataplus._M_p = (pointer)local_190._0_8_;
    goto LAB_012974c5;
  }
  KeywordHelper::WriteOptionallyQuoted(&local_150,&local_90.schema,'\"',true);
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_150);
  pp_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
            &local_110.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  p_Var7 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(plVar6 + 2);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar6 == p_Var7) {
    local_110.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var7->_M_pi;
    local_110._24_8_ = plVar6[3];
    local_110.type_._0_8_ = pp_Var4;
  }
  else {
    local_110.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var7->_M_pi;
    local_110.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar6;
  }
  local_110.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)plVar6[1];
  *plVar6 = (long)p_Var7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  KeywordHelper::WriteOptionallyQuoted((string *)local_130,&local_90.name,'\"',true);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(local_110.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _vptr_ExtraTypeInfo + local_130._8_8_);
  _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_110.type_._0_8_ != pp_Var4) {
    _Var8._M_pi = local_110.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
  }
  if (_Var8._M_pi < p_Var2) {
    uVar9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._0_8_ != &local_120) {
      uVar9 = local_120._M_allocated_capacity;
    }
    if ((ulong)uVar9 < p_Var2) goto LAB_01297407;
    plVar6 = (long *)::std::__cxx11::string::replace
                               ((ulong)local_130,0,(char *)0x0,local_110.type_._0_8_);
  }
  else {
LAB_01297407:
    plVar6 = (long *)::std::__cxx11::string::_M_append((char *)&local_110,local_130._0_8_);
  }
  local_190._0_8_ = local_190 + 0x10;
  pTVar1 = (Transformer *)(plVar6 + 2);
  if ((Transformer *)*plVar6 == pTVar1) {
    local_190._16_8_ = (pTVar1->parent).ptr;
    local_190._24_8_ = plVar6[3];
  }
  else {
    local_190._16_8_ = (pTVar1->parent).ptr;
    local_190._0_8_ = (Transformer *)*plVar6;
  }
  local_190._8_8_ = plVar6[1];
  *plVar6 = (long)pTVar1;
  plVar6[1] = 0;
  *(undefined1 *)&(pTVar1->parent).ptr = 0;
  ::std::__cxx11::string::operator=((string *)&local_d0,(string *)local_190);
  if ((Transformer *)local_190._0_8_ != (Transformer *)(local_190 + 0x10)) {
    operator_delete((void *)local_190._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &local_120) {
    operator_delete((void *)local_130._0_8_);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_110.type_._0_8_ != pp_Var4) {
    operator_delete((void *)local_110.type_._0_8_);
  }
  psVar3 = &local_150;
LAB_012974c5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &psVar3->field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_d0,local_d0 + local_c8);
  Value::Value(&local_110,&local_b0);
  this_00 = (ConstantExpression *)operator_new(0x78);
  Value::Value((Value *)local_190,&local_110);
  ConstantExpression::ConstantExpression(this_00,(Value *)local_190);
  local_150._M_dataplus._M_p = (pointer)this_00;
  Value::~Value((Value *)local_190);
  Value::~Value(&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_110.type_._0_8_ = local_110.type_._0_8_ & 0xffffffffffffff00;
  make_uniq<duckdb::SetVariableStatement,char_const(&)[7],duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>,duckdb::SetScope>
            ((duckdb *)local_190,(char (*) [7])0x1de6b7a,
             (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
              *)&local_150,(SetScope *)&local_110);
  uVar9 = local_190._0_8_;
  local_190._0_8_ = (pointer)0x0;
  (this->parent).ptr = (Transformer *)uVar9;
  if ((ConstantExpression *)local_150._M_dataplus._M_p != (ConstantExpression *)0x0) {
    (**(code **)(*(long *)local_150._M_dataplus._M_p + 8))();
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.name._M_dataplus._M_p != &local_90.name.field_2) {
    operator_delete(local_90.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.schema._M_dataplus._M_p != &local_90.schema.field_2) {
    operator_delete(local_90.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.catalog._M_dataplus._M_p != &local_90.catalog.field_2) {
    operator_delete(local_90.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>_>)
         (unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>_>)this;
}

Assistant:

unique_ptr<SetStatement> Transformer::TransformUse(duckdb_libpgquery::PGUseStmt &stmt) {
	auto qualified_name = TransformQualifiedName(*stmt.name);
	if (!IsInvalidCatalog(qualified_name.catalog)) {
		throw ParserException("Expected \"USE database\" or \"USE database.schema\"");
	}
	string name;
	if (IsInvalidSchema(qualified_name.schema)) {
		name = KeywordHelper::WriteOptionallyQuoted(qualified_name.name, '"');
	} else {
		name = KeywordHelper::WriteOptionallyQuoted(qualified_name.schema, '"') + "." +
		       KeywordHelper::WriteOptionallyQuoted(qualified_name.name, '"');
	}
	auto name_expr = make_uniq<ConstantExpression>(Value(name));
	return make_uniq<SetVariableStatement>("schema", std::move(name_expr), SetScope::AUTOMATIC);
}